

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChMovingAverage::ChMovingAverage(ChMovingAverage *this,valarray<double> *data,int n)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  
  (this->m_out)._M_size = 0;
  (this->m_out)._M_data = (double *)0x0;
  uVar15 = (uint)data->_M_size;
  std::valarray<double>::resize(&this->m_out,(long)(int)uVar15,0.0);
  pdVar3 = data->_M_data;
  pdVar4 = (this->m_out)._M_data;
  uVar5 = uVar15;
  if (n < (int)uVar15) {
    uVar5 = n;
  }
  uVar14 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5);
  pdVar9 = pdVar3 + -1;
  pdVar11 = pdVar3;
  for (uVar10 = 0; pdVar11 = pdVar11 + 1, uVar10 != uVar14; uVar10 = uVar10 + 1) {
    dVar1 = pdVar3[uVar10];
    pdVar4[uVar10] = dVar1;
    pdVar12 = pdVar9;
    for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
      dVar2 = *pdVar12;
      pdVar12 = pdVar12 + -1;
      dVar1 = dVar1 + dVar2 + pdVar11[uVar13];
      pdVar4[uVar10] = dVar1;
    }
    pdVar9 = pdVar9 + 1;
    pdVar4[uVar10] = dVar1 / (double)((int)uVar10 * 2 + 1);
  }
  pdVar3 = data->_M_data;
  pdVar4 = (this->m_out)._M_data;
  uVar8 = uVar15;
  for (uVar10 = 0; uVar8 = uVar8 - 1, uVar10 != uVar14; uVar10 = uVar10 + 1) {
    iVar6 = ~(uint)uVar10 + uVar15;
    pdVar9 = pdVar3 + (long)(int)uVar8 + -1;
    dVar1 = pdVar3[iVar6];
    pdVar4[iVar6] = dVar1;
    for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
      dVar2 = *pdVar9;
      pdVar9 = pdVar9 + -1;
      dVar1 = dVar1 + dVar2 + pdVar3[(long)(int)uVar8 + uVar13 + 1];
      pdVar4[iVar6] = dVar1;
    }
    pdVar4[iVar6] = dVar1 / (double)(int)((uint)uVar10 * 2 + 1);
  }
  pdVar3 = data->_M_data;
  pdVar4 = (this->m_out)._M_data;
  lVar7 = (long)(int)uVar15;
  if ((long)n < (long)(int)uVar15) {
    lVar7 = (long)n;
  }
  pdVar9 = pdVar3 + lVar7 + 1;
  pdVar11 = pdVar3 + lVar7 + -1;
  for (; lVar7 < (int)(uVar15 - uVar5); lVar7 = lVar7 + 1) {
    dVar1 = pdVar3[lVar7];
    pdVar4[lVar7] = dVar1;
    pdVar12 = pdVar11;
    for (uVar14 = 0; (uint)(~(n >> 0x1f) & n) != uVar14; uVar14 = uVar14 + 1) {
      dVar2 = *pdVar12;
      pdVar12 = pdVar12 + -1;
      dVar1 = dVar1 + dVar2 + pdVar9[uVar14];
      pdVar4[lVar7] = dVar1;
    }
    pdVar9 = pdVar9 + 1;
    pdVar11 = pdVar11 + 1;
    pdVar4[lVar7] = dVar1 / (double)(n * 2 + 1);
  }
  return;
}

Assistant:

ChMovingAverage::ChMovingAverage(const std::valarray<double>& data, int n) {
    int np = (int)data.size();
    m_out.resize(np);

    // Start and end of data
    int lim = ChMin(n, np);
    for (int i = 0; i < lim; i++) {
        m_out[i] = data[i];
        for (int j = 1; j <= i; j++)
            m_out[i] += data[i - j] + data[i + j];
        m_out[i] /= (2 * i + 1);
    }

    for (int i = 0; i < lim; i++) {
        m_out[np - 1 - i] = data[np - 1 - i];
        for (int j = 1; j <= i; j++)
            m_out[np - 1 - i] += data[np - 1 - i - j] + data[np - 1 - i + j];
        m_out[np - 1 - i] /= (2 * i + 1);
    }

    // Middle values
    for (int i = lim; i < np - lim; i++) {
        m_out[i] = data[i];
        for (int j = 1; j <= n; j++)
            m_out[i] += data[i - j] + data[i + j];
        m_out[i] /= (2 * n + 1);
    }
}